

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariantSet
          (AsciiParser *this,int64_t primIdx,int64_t parentPrimIdx,uint32_t depth,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          *variantSetOut)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Specifier s;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames;
  char *pcVar3;
  Specifier spec;
  int iVar4;
  allocator local_381;
  string variantName;
  int64_t idx;
  char mc;
  size_t local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  PrimMetaMap metas;
  string local_2f8;
  VariantContent variantContent;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  variantContentMap;
  ostringstream ss_e;
  string local_70;
  string local_50 [32];
  
  if (variantSetOut ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
       *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[ASCII]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x120d);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[InternalError] variantSetOut arg is nullptr.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&variantContent);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  }
  else {
    bVar1 = Expect(this,'{');
    if (bVar1) {
      bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      variantContentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &variantContentMap._M_t._M_impl.super__Rb_tree_header._M_header;
      variantContentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      variantContentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      variantContentMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      variantContentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           variantContentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_002a0731:
      do {
        bVar1 = Eof(this);
        if (bVar1) {
LAB_002a0e7e:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          ::_M_move_assign(&variantSetOut->_M_t,&variantContentMap);
          bVar1 = true;
          goto LAB_002a0e6c;
        }
        bVar1 = Char1(this,(char *)&ss_e);
        if (!bVar1) goto LAB_002a0e69;
        if (ss_e == (ostringstream)0x7d) goto LAB_002a0e7e;
        Rewind(this,1);
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) goto LAB_002a0e69;
        variantName._M_string_length = 0;
        variantName.field_2._M_local_buf[0] = '\0';
        variantName._M_dataplus._M_p = (pointer)&variantName.field_2;
        bVar1 = ReadBasicType(this,&variantName);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[ASCII]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1238);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)&ss_e,
                                     "Failed to parse variant name for `variantSet` statement.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&variantContent);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002a0e5f:
          ::std::__cxx11::string::_M_dispose();
          goto LAB_002a0e69;
        }
        bVar1 = SkipWhitespace(this);
        if (!bVar1) goto LAB_002a0e5f;
        metas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        metas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &metas._M_t._M_impl.super__Rb_tree_header._M_header;
        metas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        metas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar1 = LookChar1(this,&mc);
        if (!bVar1) {
LAB_002a0e55:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
          ::~_Rb_tree(&metas._M_t);
          goto LAB_002a0e5f;
        }
        if ((mc == '(') && (bVar1 = ParsePrimMetas(this,&metas), !bVar1)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[ASCII]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x124a);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)&ss_e,
                                     "Failed to parse PrimSpec metas in variant statement.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&variantContent);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          goto LAB_002a0e55;
        }
        bVar1 = Expect(this,'{');
        if ((!bVar1) || (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), !bVar1))
        goto LAB_002a0e55;
        variantContent.metas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        variantContent.metas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        variantContent.metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &variantContent.metas._M_t._M_impl.super__Rb_tree_header._M_header;
        variantContent.props._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        variantContent.props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        variantContent.primIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        variantContent.primIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        variantContent.metas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        variantContent.primIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        variantContent.props._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &variantContent.props._M_t._M_impl.super__Rb_tree_header._M_header;
        variantContent.variantSets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        variantContent.variantSets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        variantContent.properties.
        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        variantContent.properties.
        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        variantContent.props._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        variantContent.properties.
        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        variantContent.variantSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &variantContent.variantSets._M_t._M_impl.super__Rb_tree_header._M_header;
        variantContent.variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        variantContent.metas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             variantContent.metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        variantContent.props._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             variantContent.props._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        variantContent.variantSets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             variantContent.variantSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          bVar1 = Eof(this);
          if (bVar1) {
LAB_002a0a46:
            bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar1) {
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
              ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                           *)&variantContent,&metas._M_t);
              ::std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>
              ::
              _M_emplace_unique<std::__cxx11::string&,tinyusdz::ascii::AsciiParser::VariantContent&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>
                          *)&variantContentMap,&variantName,&variantContent);
              VariantContent::~VariantContent(&variantContent);
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
              ::~_Rb_tree(&metas._M_t);
              ::std::__cxx11::string::_M_dispose();
              goto LAB_002a0731;
            }
LAB_002a0e48:
            VariantContent::~VariantContent(&variantContent);
            goto LAB_002a0e55;
          }
          bVar1 = Char1(this,(char *)&ss_e);
          iVar4 = 0;
          if (ss_e == (ostringstream)0x7d) {
            iVar4 = 0xb;
          }
          if (!bVar1) {
            iVar4 = 1;
          }
          if (iVar4 != 0) {
            if (iVar4 == 0xb) goto LAB_002a0a46;
            goto LAB_002a0ab2;
          }
          bVar1 = Rewind(this,1);
          if (!bVar1) break;
          _mc = (pointer)&local_338;
          local_340 = 0;
          local_338._M_local_buf[0] = '\0';
          bVar1 = ReadBasicType(this,(Identifier *)&mc);
          if (!bVar1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x126f);
            ::std::operator<<(poVar2," ");
            pcVar3 = "Failed to parse an identifier in variantSet block statement.";
LAB_002a0cd3:
            poVar2 = ::std::operator<<((ostream *)&ss_e,pcVar3);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::stringbuf::str();
            PushError(this,&local_2f8);
            ::std::__cxx11::string::_M_dispose();
LAB_002a0e39:
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002a0e3e:
            ::std::__cxx11::string::_M_dispose();
            goto LAB_002a0e48;
          }
          bVar1 = Rewind(this,local_340);
          if (!bVar1) goto LAB_002a0e3e;
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&mc,"variantSet");
          if (bVar1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1277);
            ::std::operator<<(poVar2," ");
            pcVar3 = "Nested `variantSet` is not supported yet.";
            goto LAB_002a0cd3;
          }
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&mc,"def");
          spec = Def;
          if (bVar1) {
LAB_002a09be:
            idx = ::std::function<long_(long)>::operator()
                            (&this->_prim_idx_assign_fun,parentPrimIdx);
            args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)primIdx;
            bVar1 = ParseBlock(this,spec,idx,primIdx,depth + 1,false);
            if (!bVar1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1290);
              ::std::operator<<(poVar2," ");
              ::std::__cxx11::string::string(local_50,"`{}` block parse failed.",&local_381);
              tinyusdz::to_string_abi_cxx11_(&local_70,(tinyusdz *)(ulong)spec,s);
              fmt::format<std::__cxx11::string>
                        ((string *)&local_2f8,(fmt *)local_50,(string *)&local_70,args);
              poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2f8);
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              PushError(this,&local_2f8);
              ::std::__cxx11::string::_M_dispose();
              goto LAB_002a0e39;
            }
            ::std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)&variantContent.primIndices,&idx);
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&mc,"over");
            spec = Over;
            if (bVar1) goto LAB_002a09be;
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&mc,"class");
            spec = Class;
            if (bVar1) goto LAB_002a09be;
            bVar1 = ParsePrimProps(this,&variantContent.props,propNames);
            if (!bVar1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"ParseVariantSet");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x129b);
              ::std::operator<<(poVar2," ");
              pcVar3 = "Failed to parse Prim attribute.";
              goto LAB_002a0cd3;
            }
          }
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          ::std::__cxx11::string::_M_dispose();
        } while (bVar1);
        iVar4 = 1;
LAB_002a0ab2:
        VariantContent::~VariantContent(&variantContent);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
        ::~_Rb_tree(&metas._M_t);
        ::std::__cxx11::string::_M_dispose();
        if (iVar4 != 0) {
LAB_002a0e69:
          bVar1 = false;
LAB_002a0e6c:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
          ::~_Rb_tree(&variantContentMap._M_t);
          return bVar1;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseVariantSet(
    const int64_t primIdx, const int64_t parentPrimIdx, const uint32_t depth,
    std::map<std::string, VariantContent> *variantSetOut) {
  if (!variantSetOut) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii,
                              "[InternalError] variantSetOut arg is nullptr.");
  }

  // variantSet =
  // {
  //   "variantName0" ( metas ) { ... }
  //   "variantName1" ( metas ) { ... }
  //   ...
  // }
  if (!Expect('{')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, VariantContent> variantContentMap;

  // for each variantStatement
  while (!Eof()) {
    {
      char c;
      if (!Char1(&c)) {
        return false;
      }

      if (c == '}') {
        // end
        break;
      }

      Rewind(1);
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // string
    std::string variantName;
    if (!ReadBasicType(&variantName)) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Failed to parse variant name for `variantSet` statement.");
    }

    if (!SkipWhitespace()) {
      return false;
    }

    // Optional: PrimSpec meta
    PrimMetaMap metas;
    {
      char mc;
      if (!LookChar1(&mc)) {
        return false;
      }

      if (mc == '(') {
        if (!ParsePrimMetas(&metas)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii, "Failed to parse PrimSpec metas in variant statement.");
        }
      }
    }

    if (!Expect('{')) {
      return false;
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    VariantContent variantContent;

    while (!Eof()) {
      {
        char c;
        if (!Char1(&c)) {
          return false;
        }

        if (c == '}') {
          DCOUT("End block in variantSet stmt.");
          // end block
          break;
        }
      }

      if (!Rewind(1)) {
        return false;
      }

      DCOUT("Read first token in VariantSet stmt");
      Identifier tok;
      if (!ReadBasicType(&tok)) {
        PUSH_ERROR_AND_RETURN(
            "Failed to parse an identifier in variantSet block statement.");
      }

      if (!Rewind(tok.size())) {
        return false;
      }

      if (tok == "variantSet") {
        PUSH_ERROR_AND_RETURN("Nested `variantSet` is not supported yet.");
      }

      Specifier child_spec{Specifier::Invalid};
      if (tok == "def") {
        child_spec = Specifier::Def;
      } else if (tok == "over") {
        child_spec = Specifier::Over;
      } else if (tok == "class") {
        child_spec = Specifier::Class;
      }

      // No specifier => Assume properties only.
      // Has specifier => Prim
      if (child_spec != Specifier::Invalid) {
        // FIXME: Assign idx dedicated for variant.
        int64_t idx = _prim_idx_assign_fun(parentPrimIdx);
        DCOUT("enter parseBlock in variantSet. spec = "
              << to_string(child_spec) << ", idx = " << idx
              << ", rootIdx = " << primIdx);

        // recusive call
        if (!ParseBlock(child_spec, idx, primIdx, depth + 1,
                        /* in_variantStmt */ true)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("`{}` block parse failed.", to_string(child_spec)));
        }
        DCOUT(fmt::format("Done parse `{}` block.", to_string(child_spec)));

        DCOUT(fmt::format("Add primIdx {} to variant {}", idx, variantName));
        variantContent.primIndices.push_back(idx);

      } else {
        DCOUT("Enter ParsePrimProps.");
        if (!ParsePrimProps(&variantContent.props,
                            &variantContent.properties)) {
          PUSH_ERROR_AND_RETURN("Failed to parse Prim attribute.");
        }
        DCOUT(fmt::format("Done parse ParsePrimProps."));
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    DCOUT(fmt::format("variantSet item {} parsed.", variantName));

    variantContent.metas = metas;
    variantContentMap.emplace(variantName, variantContent);
  }

  (*variantSetOut) = std::move(variantContentMap);

  return true;
}